

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O3

nng_err nni_http_req_parse(nng_http *conn,void *buf,size_t n,size_t *lenp)

{
  byte bVar1;
  size_t sVar2;
  nng_http_status nVar3;
  int iVar4;
  nng_err nVar5;
  nni_http_req *pnVar6;
  char *pcVar7;
  char *pcVar8;
  nng_err nVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  
  pnVar6 = nni_http_conn_req(conn);
  if (n == 0) {
    sVar13 = 0;
    nVar5 = NNG_EAGAIN;
  }
  else {
    sVar2 = 0;
    do {
      sVar13 = sVar2;
      nVar5 = NNG_EAGAIN;
      uVar12 = 0;
      bVar10 = 0;
      while (bVar1 = *(byte *)((long)buf + uVar12), bVar1 != 10) {
        nVar9 = NNG_EPROTO;
        if ((bVar10 == 0xd) || (bVar1 < 0x20 && bVar1 != 0xd)) goto LAB_00139a99;
        uVar12 = uVar12 + 1;
        bVar10 = bVar1;
        if (n == uVar12) goto LAB_00139aa7;
      }
      *(char *)((long)buf + (uVar12 - (bVar10 == 0xd))) = '\0';
      if (*buf == '\0') {
        sVar13 = sVar13 + uVar12 + 1;
        nVar9 = NNG_OK;
LAB_00139a99:
        (pnVar6->data).parsed = false;
        nVar5 = nVar9;
        goto LAB_00139aa7;
      }
      if ((pnVar6->data).parsed == true) {
        http_parse_header(conn,buf);
      }
      else {
        (pnVar6->data).parsed = true;
        nVar3 = nni_http_get_status(conn);
        if (nVar3 < NNG_HTTP_STATUS_BAD_REQUEST) {
          pcVar7 = strchr((char *)buf,0x20);
          if (pcVar7 == (char *)0x0) {
LAB_00139a18:
            nVar3 = NNG_HTTP_STATUS_BAD_REQUEST;
          }
          else {
            *pcVar7 = '\0';
            pcVar7 = pcVar7 + 1;
            pcVar8 = strchr(pcVar7,0x20);
            if (pcVar8 == (char *)0x0) goto LAB_00139a18;
            *pcVar8 = '\0';
            iVar4 = nni_url_canonify_uri(pcVar7);
            if (iVar4 != 0) goto LAB_00139a18;
            iVar4 = nni_http_set_version(conn,pcVar8 + 1);
            if (iVar4 == 0) {
              nni_http_set_method(conn,(char *)buf);
              nni_http_set_uri(conn,pcVar7,(char *)0x0);
              goto LAB_00139a27;
            }
            nVar3 = NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP;
          }
          nni_http_set_status(conn,nVar3,(char *)0x0);
        }
      }
LAB_00139a27:
      buf = (void *)((long)buf + uVar12 + 1);
      uVar11 = n - 1;
      nVar5 = NNG_EAGAIN;
      sVar2 = sVar13 + uVar12 + 1;
      n = ~uVar12 + n;
    } while (uVar11 != uVar12);
    sVar13 = sVar13 + uVar12 + 1;
  }
LAB_00139aa7:
  *lenp = sVar13;
  return nVar5;
}

Assistant:

nng_err
nni_http_req_parse(nng_http *conn, void *buf, size_t n, size_t *lenp)
{

	size_t        len = 0;
	size_t        cnt;
	int           rv  = 0;
	nni_http_req *req = nni_http_conn_req(conn);

	for (;;) {
		uint8_t *line;
		if ((rv = http_scan_line(buf, n, &cnt)) != 0) {
			break;
		}

		len += cnt;
		line = buf;
		buf  = line + cnt;
		n -= cnt;

		if (*line == '\0') {
			break;
		}

		if (req->data.parsed) {
			rv = http_parse_header(conn, line);
		} else {
			req->data.parsed = true;
			rv               = http_req_parse_line(conn, line);
		}
	}

	if (rv != NNG_EAGAIN) {
		req->data.parsed = false;
	}
	*lenp = len;
	return (rv);
}